

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<void> *
testing::internal::ActionResultHolder<void>::
PerformAction<void(std::vector<unsigned_char,std::allocator<unsigned_char>>const&,ot::commissioner::Error)>
          (Action<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
           *action,ArgumentTuple *args)

{
  ActionResultHolder<void> *this;
  tuple<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
  local_48;
  ArgumentTuple *local_18;
  ArgumentTuple *args_local;
  Action<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
  *action_local;
  
  local_18 = args;
  args_local = (ArgumentTuple *)action;
  std::
  tuple<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
  ::tuple(&local_48,args);
  Action<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
  ::Perform(action,&local_48);
  std::
  tuple<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
  ::~tuple(&local_48);
  this = (ActionResultHolder<void> *)operator_new(8);
  ActionResultHolder(this);
  return this;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    action.Perform(std::move(args));
    return new ActionResultHolder;
  }